

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld_sampler.cpp
# Opt level: O0

void __thiscall LDSampler::LDSampler(LDSampler *this,uint32_t sp,uint32_t block_dim)

{
  uint *puVar1;
  ostream *poVar2;
  int local_2c [5];
  uint32_t local_18;
  uint32_t local_14;
  uint32_t block_dim_local;
  uint32_t sp_local;
  LDSampler *this_local;
  
  local_18 = block_dim;
  local_14 = sp;
  _block_dim_local = this;
  local_2c[4] = round_up_pow2(sp);
  local_2c[3] = 8;
  puVar1 = std::max<unsigned_int>((uint *)(local_2c + 4),(uint *)(local_2c + 3));
  this->spp = *puVar1;
  this->block_dim = local_18;
  this->samples_taken = 0;
  local_2c[2] = 0;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_unsigned_int_&,_true>
            (&this->start,local_2c + 2,&local_18);
  local_2c[1] = 0;
  local_2c[0] = 0;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&this->current,local_2c + 1,local_2c);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution(&this->distrib);
  if (local_14 < 8) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Warning: LDSampler only supports taking 8 or more samples per pixel,")
    ;
    poVar2 = std::operator<<(poVar2," will take ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->spp);
    std::operator<<(poVar2,"spp\n");
  }
  else if (local_14 != this->spp) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Warning: LDSampler only takes power of 2 samples per pixel, rounded up to"
                            );
    poVar2 = std::operator<<(poVar2," take ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->spp);
    std::operator<<(poVar2,"spp\n");
  }
  return;
}

Assistant:

LDSampler::LDSampler(uint32_t sp, uint32_t block_dim) : spp(std::max(round_up_pow2(sp), uint32_t{8})),
	block_dim(block_dim), samples_taken(0), start({0, block_dim}), current({0, 0})
{
	if (sp < 8){
		std::cout << "Warning: LDSampler only supports taking 8 or more samples per pixel,"
			<< " will take " << spp << "spp\n";
	}
	else if (sp != spp){
		std::cout << "Warning: LDSampler only takes power of 2 samples per pixel, rounded up to"
			<< " take " << spp << "spp\n";
	}
}